

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1x16_FormatASTC_12x12_SRGB_Test::
~createDFDCompressedTest1x16_FormatASTC_12x12_SRGB_Test
          (createDFDCompressedTest1x16_FormatASTC_12x12_SRGB_Test *this)

{
  void *in_RDI;
  
  ~createDFDCompressedTest1x16_FormatASTC_12x12_SRGB_Test
            ((createDFDCompressedTest1x16_FormatASTC_12x12_SRGB_Test *)0x1490a8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1x16, FormatASTC_12x12_SRGB) {
    customize(KHR_DF_MODEL_ASTC, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              11, 11,
              {
                {0, 127, KHR_DF_CHANNEL_ASTC_DATA, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ASTC, 12, 12, 1, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}